

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cpp
# Opt level: O0

void UndiffItem(int *pPast,int *pDiff,int *pOut,int Size,int *pDataRate)

{
  uchar *puVar1;
  int in_ECX;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  int *in_R8;
  long in_FS_OFFSET;
  uchar *pEnd;
  uchar aBuf [5];
  int local_2c;
  int *local_28;
  int *local_20;
  int *local_18;
  uchar local_d [5];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  for (local_2c = in_ECX; local_2c != 0; local_2c = local_2c + -1) {
    *local_28 = *local_18 + *local_20;
    if (*local_20 == 0) {
      *in_R8 = *in_R8 + 1;
    }
    else {
      puVar1 = CVariableInt::Pack(local_d,*local_20);
      *in_R8 = ((int)puVar1 - (int)local_d) * 8 + *in_R8;
    }
    local_28 = local_28 + 1;
    local_18 = local_18 + 1;
    local_20 = local_20 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void UndiffItem(const int *pPast, const int *pDiff, int *pOut, int Size, int *pDataRate)
{
	while(Size)
	{
		*pOut = *pPast+*pDiff;

		if(*pDiff == 0)
			*pDataRate += 1;
		else
		{
			unsigned char aBuf[CVariableInt::MAX_BYTES_PACKED];
			unsigned char *pEnd = CVariableInt::Pack(aBuf, *pDiff);
			*pDataRate += (int)(pEnd - (unsigned char*)aBuf) * 8;
		}

		pOut++;
		pPast++;
		pDiff++;
		Size--;
	}
}